

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoAssembler.cpp
# Opt level: O3

AssemblerReturnValues __thiscall
NanoAssembler::assembleToFile(NanoAssembler *this,string *inputFile,string *outputFile)

{
  pointer pcVar1;
  pointer pAVar2;
  bool bVar3;
  char cVar4;
  AssemblerReturnValues AVar5;
  string *this_00;
  pointer pAVar6;
  vector<AssemberInstruction,_std::allocator<AssemberInstruction>_> lines;
  AssemberInstruction inst;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  labelMap;
  ofstream file;
  vector<AssemberInstruction,_std::allocator<AssemberInstruction>_> local_2e8;
  string local_2c8;
  long *local_2a8 [2];
  long local_298 [2];
  long local_288;
  undefined1 uStack_280;
  undefined7 uStack_27f;
  undefined1 uStack_278;
  undefined8 uStack_277;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_268;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  local_2e8.super__Vector_base<AssemberInstruction,_std::allocator<AssemberInstruction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8.super__Vector_base<AssemberInstruction,_std::allocator<AssemberInstruction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8.super__Vector_base<AssemberInstruction,_std::allocator<AssemberInstruction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_268._M_buckets = &local_268._M_single_bucket;
  local_268._M_bucket_count = 1;
  local_268._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_268._M_element_count = 0;
  local_268._M_rehash_policy._M_max_load_factor = 1.0;
  local_268._M_rehash_policy._M_next_resize = 0;
  local_268._M_single_bucket = (__node_base_ptr)0x0;
  pcVar1 = (inputFile->_M_dataplus)._M_p;
  this_00 = &local_2c8;
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this_00,pcVar1,pcVar1 + inputFile->_M_string_length);
  bVar3 = readLines((NanoAssembler *)this_00,&local_2c8,&local_2e8,
                    (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                     *)&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  AVar5 = IOError;
  if (bVar3) {
    bVar3 = assemble(this,&local_2e8,
                     (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      *)&local_268);
    AVar5 = AssemblerError;
    if (bVar3) {
      std::ofstream::ofstream(&local_230,(string *)outputFile,_S_out|_S_bin);
      cVar4 = std::__basic_file<char>::is_open();
      pAVar2 = local_2e8.
               super__Vector_base<AssemberInstruction,_std::allocator<AssemberInstruction>_>._M_impl
               .super__Vector_impl_data._M_finish;
      AVar5 = IOError;
      if (cVar4 != '\0') {
        if (local_2e8.super__Vector_base<AssemberInstruction,_std::allocator<AssemberInstruction>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            local_2e8.super__Vector_base<AssemberInstruction,_std::allocator<AssemberInstruction>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pAVar6 = local_2e8.
                   super__Vector_base<AssemberInstruction,_std::allocator<AssemberInstruction>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          do {
            pcVar1 = (pAVar6->line)._M_dataplus._M_p;
            local_2a8[0] = local_298;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_2a8,pcVar1,pcVar1 + (pAVar6->line)._M_string_length);
            local_288 = *(long *)pAVar6->bytecode;
            uStack_277 = *(undefined8 *)((long)&pAVar6->length + 1);
            uStack_278 = (undefined1)((ulong)*(undefined8 *)(pAVar6->bytecode + 9) >> 0x38);
            uStack_280 = (undefined1)*(undefined8 *)(pAVar6->bytecode + 8);
            uStack_27f = (undefined7)((ulong)*(undefined8 *)(pAVar6->bytecode + 8) >> 8);
            std::ostream::write((char *)&local_230,(long)&local_288);
            if (local_2a8[0] != local_298) {
              operator_delete(local_2a8[0],local_298[0] + 1);
            }
            pAVar6 = pAVar6 + 1;
          } while (pAVar6 != pAVar2);
        }
        AVar5 = Success;
        std::ofstream::close();
      }
      local_230 = _VTT;
      *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
      std::filebuf::~filebuf(local_228);
      std::ios_base::~ios_base(local_138);
    }
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_268);
  std::vector<AssemberInstruction,_std::allocator<AssemberInstruction>_>::~vector(&local_2e8);
  return AVar5;
}

Assistant:

AssemblerReturnValues NanoAssembler::assembleToFile(std::string inputFile, std::string outputFile) {
	std::vector<AssemberInstruction> lines;
	std::unordered_map<std::string, size_t> labelMap;
	// Load file from disk
	if (!readLines(inputFile, lines, labelMap)) {
		return AssemblerReturnValues::IOError;
	}
	// Compile the file to bytecode
	if (assemble(lines, labelMap)) {
		// Write to disk
		std::ofstream file(outputFile, std::ios::out | std::ios::binary);
		if (file.is_open()) {
			for (AssemberInstruction inst : lines)
				file.write((const char*)& inst.bytecode[0], inst.length);
			file.close();
			return AssemblerReturnValues::Success;
		}
		return AssemblerReturnValues::IOError;
	}
	return AssemblerReturnValues::AssemblerError;
}